

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::CInput(CInput *this)

{
  undefined8 *in_RDI;
  IEngineInput *in_stack_ffffffffffffffe0;
  undefined8 *block;
  
  IEngineInput::IEngineInput(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__CInput_002978c0;
  block = in_RDI + 0x246;
  array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::array
            ((array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *)0x13262a);
  mem_zero(block,(uint)((ulong)in_RDI >> 0x20));
  mem_zero(block,(uint)((ulong)in_RDI >> 0x20));
  in_RDI[0x244] = 0;
  in_RDI[0x245] = 0;
  in_RDI[0x243] = 0;
  *(undefined4 *)(in_RDI + 0x394) = 1;
  *(undefined1 *)(in_RDI + 0x249) = 0;
  in_RDI[0x24a] = 0;
  in_RDI[0x248] = 0;
  *(undefined1 *)(in_RDI + 0x24b) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x1284) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x127c) = 0;
  *(undefined4 *)(in_RDI + 0x250) = 0;
  *(undefined4 *)(in_RDI + 0x2d3) = 0;
  *(undefined4 *)((long)in_RDI + 0x169c) = 0xffffffff;
  return;
}

Assistant:

CInput::CInput()
{
	mem_zero(m_aInputCount, sizeof(m_aInputCount));
	mem_zero(m_aInputState, sizeof(m_aInputState));

	m_pConfig = 0;
	m_pConsole = 0;
	m_pGraphics = 0;

	m_InputCounter = 1;
	m_MouseInputRelative = false;
	m_pClipboardText = 0;

	m_pActiveJoystick = 0x0;

	m_MouseDoubleClick = false;

	m_NumEvents = 0;

	m_CompositionLength = COMP_LENGTH_INACTIVE;
	m_CompositionCursor = 0;
	m_CompositionSelectedLength = 0;
	m_CandidateCount = 0;
	m_CandidateSelectedIndex = -1;
}